

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O3

int strip_comments(char *line)

{
  char *pcVar1;
  char *pcVar2;
  
  if (strip_comments_in_comment != '\x01') goto LAB_00104340;
  while (pcVar1 = strchr(line,0x7d), pcVar2 = line, pcVar1 != (char *)0x0) {
    strcpy(line,pcVar1 + 1);
    strip_comments_in_comment = '\0';
LAB_00104340:
    pcVar2 = strchr(line,0x2d);
    if ((pcVar2 != (char *)0x0) && (pcVar2[1] == '-')) break;
    pcVar2 = strchr(line,0x7b);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    strip_comments_in_comment = '\x01';
    *pcVar2 = ' ';
  }
  *pcVar2 = '\0';
  return 0;
}

Assistant:

int
strip_comments(char *line)
{
    static int in_comment = 0;
    char *cp1, *cp2;

    cp1 = line;
    
    while (1)   /* traverse the entire string */
        {
        if (in_comment)
            {
            if ((cp2 = strchr(cp1, '}')) != NULL) /* comment ends */
                {
                strcpy(cp1, cp2 + 1);
                in_comment = 0;
                continue;
                }
            else 
                {
                *cp1 = '\0';
                break;
                }
            }
        else    /* not in_comment */
            {
            if ((cp2 = strchr(cp1, '-')) != NULL)
                {
                if (*(cp2 + 1) == '-')  /* found a '--' comment */
                    {
                    *cp2 = '\0';
                    break;
                    }
                }
            if ((cp2 = strchr(cp1, '{')) != NULL) /* comment starts */
                {
                in_comment = 1;
                *cp2 = ' ';
                continue;
                }
            else break;
            }
        }
    return(0);
}